

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighteraxe.cpp
# Opt level: O3

int AF_A_FAxeCheckUpG(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  player_t *player;
  AWeapon *this;
  PClass *pPVar3;
  PClass *pPVar4;
  FState *state;
  FString *this_00;
  char *__assertion;
  undefined8 *puVar5;
  long lVar6;
  bool bVar7;
  VMValue params [3];
  FName local_6c;
  anon_union_16_5_cf148060_for_VMValue_0 local_68;
  undefined8 *local_58;
  undefined4 local_50;
  undefined1 local_4c;
  FString local_48;
  undefined4 local_40;
  char local_3c [12];
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005db852;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005db842;
  puVar5 = (undefined8 *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (puVar5 == (undefined8 *)0x0) goto LAB_005db695;
    pPVar4 = (PClass *)puVar5[1];
    if (pPVar4 == (PClass *)0x0) {
      pPVar4 = (PClass *)(**(code **)*puVar5)(puVar5);
      puVar5[1] = pPVar4;
    }
    bVar7 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar3 && bVar7) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar7 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar3) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar7) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005db852;
    }
  }
  else {
    if (puVar5 != (undefined8 *)0x0) goto LAB_005db842;
LAB_005db695:
    puVar5 = (undefined8 *)0x0;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) goto LAB_005db75d;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_005db842:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_005db852;
    }
    puVar2 = (undefined8 *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (puVar2 != (undefined8 *)0x0) {
        pPVar4 = (PClass *)puVar2[1];
        if (pPVar4 == (PClass *)0x0) {
          pPVar4 = (PClass *)(**(code **)*puVar2)(puVar2);
          puVar2[1] = pPVar4;
        }
        bVar7 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar3 && bVar7) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar7 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar3) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar7) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005db852;
        }
      }
    }
    else if (puVar2 != (undefined8 *)0x0) goto LAB_005db842;
  }
  if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005db75d:
    player = (player_t *)puVar5[0x40];
    if (player != (player_t *)0x0) {
      this = player->ReadyWeapon;
      if ((((this->Ammo1).field_0.p)->super_AInventory).Amount < 1) {
        local_6c.Index = FName::NameManager::FindName(&FName::NameData,"Select",false);
        state = AActor::FindState((AActor *)this,&local_6c);
        P_SetPsprite(player,PSP_WEAPON,state,false);
      }
      else {
        local_68.field_1.atag = 1;
        local_68.field_3.Type = '\x03';
        local_50 = 1;
        local_4c = 3;
        local_48.Chars = (char *)0x0;
        local_40 = 8;
        local_3c[0] = 3;
        local_68.field_1.a = puVar5;
        local_58 = puVar5;
        VMFrameStack::Call(stack,&A_Raise_VMPtr->super_VMFunction,(VMValue *)&local_68.field_1,3,
                           (VMReturn *)0x0,0,(VMException **)0x0);
        lVar6 = -0x30;
        this_00 = &local_48;
        do {
          if (*(char *)((long)&this_00[1].Chars + 4) == '\x02') {
            FString::~FString(this_00);
          }
          this_00 = this_00 + -2;
          lVar6 = lVar6 + 0x10;
        } while (lVar6 != 0);
      }
    }
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_005db852:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                ,0x96,"int AF_A_FAxeCheckUpG(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FAxeCheckUpG)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (nullptr == (player = self->player))
	{
		return 0;
	}
	if (player->ReadyWeapon->Ammo1->Amount <= 0)
	{
		P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->FindState ("Select"));
	}
	else
	{
		CALL_ACTION(A_Raise, self);
	}
	return 0;
}